

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.cpp
# Opt level: O0

uint __thiscall CScript::GetSigOpCount(CScript *this,CScript *scriptSig)

{
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  last;
  bool bVar1;
  undefined1 fAccurate;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  first;
  const_iterator *in_RDI;
  long in_FS_OFFSET;
  opcodetype opcode;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vData;
  const_iterator pc;
  CScript subscript;
  CScript *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  const_iterator in_stack_ffffffffffffff58;
  undefined6 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff66;
  undefined1 in_stack_ffffffffffffff67;
  CScript *in_stack_ffffffffffffff68;
  CScript *in_stack_ffffffffffffff78;
  uint local_50;
  int local_4c;
  undefined1 local_48 [64];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = IsPayToScriptHash((CScript *)in_stack_ffffffffffffff58.ptr);
  if (bVar1) {
    local_48._24_8_ =
         prevector<28U,_unsigned_char,_unsigned_int,_int>::begin
                   ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                    CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffff48);
    do {
      first._M_current =
           (uchar *)prevector<28U,_unsigned_char,_unsigned_int,_int>::end
                              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                               CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
      fAccurate = prevector<28U,_unsigned_char,_unsigned_int,_int>::const_iterator::operator<
                            ((const_iterator *)
                             CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                             in_stack_ffffffffffffff58);
      if (!(bool)fAccurate) {
        in_stack_ffffffffffffff58.ptr = local_48;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
        last._M_current._6_1_ = in_stack_ffffffffffffff66;
        last._M_current._0_6_ = in_stack_ffffffffffffff60;
        last._M_current._7_1_ = fAccurate;
        CScript<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  (in_stack_ffffffffffffff48,first,last);
        local_50 = GetSigOpCount((CScript *)first._M_current,(bool)fAccurate);
        ~CScript(in_stack_ffffffffffffff48);
        goto LAB_00e9b567;
      }
      in_stack_ffffffffffffff66 =
           GetOp(in_stack_ffffffffffffff78,in_RDI,(opcodetype *)first._M_current,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 CONCAT17(fAccurate,CONCAT16(in_stack_ffffffffffffff66,in_stack_ffffffffffffff60)));
      if (!(bool)in_stack_ffffffffffffff66) {
        local_50 = 0;
        goto LAB_00e9b567;
      }
    } while (local_4c < 0x61);
    local_50 = 0;
LAB_00e9b567:
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               in_stack_ffffffffffffff58.ptr);
  }
  else {
    local_50 = GetSigOpCount(in_stack_ffffffffffffff68,(bool)in_stack_ffffffffffffff67);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_50;
}

Assistant:

unsigned int CScript::GetSigOpCount(const CScript& scriptSig) const
{
    if (!IsPayToScriptHash())
        return GetSigOpCount(true);

    // This is a pay-to-script-hash scriptPubKey;
    // get the last item that the scriptSig
    // pushes onto the stack:
    const_iterator pc = scriptSig.begin();
    std::vector<unsigned char> vData;
    while (pc < scriptSig.end())
    {
        opcodetype opcode;
        if (!scriptSig.GetOp(pc, opcode, vData))
            return 0;
        if (opcode > OP_16)
            return 0;
    }

    /// ... and return its opcount:
    CScript subscript(vData.begin(), vData.end());
    return subscript.GetSigOpCount(true);
}